

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O0

string * Disassembler::iType(string *__return_storage_ptr__,string *bin,int line)

{
  uint line_00;
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int line_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  uint local_29c;
  undefined1 local_298 [4];
  int l;
  undefined1 local_278 [8];
  string label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined4 local_1f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  undefined1 local_110 [8];
  string imm;
  undefined1 local_d0 [8];
  string rt;
  undefined1 local_90 [8];
  string rs;
  string local_60;
  undefined1 local_40 [8];
  string op;
  int line_local;
  string *bin_local;
  
  op.field_2._12_4_ = line;
  std::__cxx11::string::substr((ulong)&local_60,(ulong)bin);
  AsmFuncts::getOpCode((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::substr((ulong)((long)&rt.field_2 + 8),(ulong)bin);
  AsmFuncts::getRegCode((string *)local_90,(string *)((long)&rt.field_2 + 8));
  std::__cxx11::string::~string((string *)(rt.field_2._M_local_buf + 8));
  std::__cxx11::string::substr((ulong)((long)&imm.field_2 + 8),(ulong)bin);
  AsmFuncts::getRegCode((string *)local_d0,(string *)((long)&imm.field_2 + 8));
  std::__cxx11::string::~string((string *)(imm.field_2._M_local_buf + 8));
  std::__cxx11::string::substr((ulong)&local_130,(ulong)bin);
  iVar3 = Conversion::binToDec(&local_130);
  std::__cxx11::to_string((string *)local_110,iVar3);
  std::__cxx11::string::~string((string *)&local_130);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"sw");
  if (!bVar2) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"lw");
    if (!bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"lui");
      if (bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&label.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                       ," ");
        std::operator+(&local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&label.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                      );
        std::operator+(&local_218,&local_238,", ");
        std::operator+(__return_storage_ptr__,&local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)(label.field_2._M_local_buf + 8));
        local_1f4 = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"bne");
        if (!bVar2) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"beq");
          if (!bVar2) {
            std::operator+(&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40," ");
            std::operator+(&local_4a0,&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0);
            std::operator+(&local_480,&local_4a0,", ");
            std::operator+(&local_460,&local_480,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90);
            std::operator+(&local_440,&local_460,", ");
            std::operator+(__return_storage_ptr__,&local_440,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_110);
            std::__cxx11::string::~string((string *)&local_440);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_480);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4c0);
            local_1f4 = 1;
            goto LAB_00180163;
          }
        }
        std::__cxx11::to_string((string *)local_298,labelCount);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"LABEL_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298);
        std::__cxx11::string::~string((string *)local_298);
        uVar1 = op.field_2._12_4_;
        iVar3 = std::__cxx11::stoi((string *)local_110,(size_t *)0x0,10);
        local_29c = uVar1 + 1 + iVar3;
        bVar2 = labelExists(local_29c);
        line_00 = local_29c;
        if (bVar2) {
          std::operator+(&local_400,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40," ");
          std::operator+(&local_3e0,&local_400,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90);
          std::operator+(&local_3c0,&local_3e0,", ");
          std::operator+(&local_3a0,&local_3c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
          std::operator+(&local_380,&local_3a0,", ");
          getLabel_abi_cxx11_(&local_420,(Disassembler *)(ulong)local_29c,line_01);
          std::operator+(__return_storage_ptr__,&local_380,&local_420);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_400);
        }
        else {
          std::__cxx11::string::string((string *)&local_2c0,(string *)local_278);
          addLabel(line_00,&local_2c0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::operator+(&local_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40," ");
          std::operator+(&local_340,&local_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90);
          std::operator+(&local_320,&local_340,", ");
          std::operator+(&local_300,&local_320,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
          std::operator+(&local_2e0,&local_300,", ");
          std::operator+(__return_storage_ptr__,&local_2e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
        }
        local_1f4 = 1;
        std::__cxx11::string::~string((string *)local_278);
      }
      goto LAB_00180163;
    }
  }
  std::operator+(&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40," ");
  std::operator+(&local_1d0,&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  std::operator+(&local_1b0,&local_1d0,", ");
  std::operator+(&local_190,&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  std::operator+(&local_170,&local_190,"(");
  std::operator+(&local_150,&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  std::operator+(__return_storage_ptr__,&local_150,")");
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  local_1f4 = 1;
LAB_00180163:
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::iType(string bin, int line){
    string op = AsmFuncts::getOpCode(bin.substr(0,6));
    string rs = AsmFuncts::getRegCode(bin.substr(6,5));
    string rt = AsmFuncts::getRegCode(bin.substr(11,5));
    string imm = std::to_string(Conversion::binToDec(bin.substr(16,16)));
    if((op == "sw") || (op == "lw")){
        return (op + " " + rt + ", " + imm + "(" + rs + ")");
    }
    if(op == "lui"){
        return (op + " " + rt + ", " + imm);
    }
    if((op == "bne")||(op == "beq")){
        string label = "LABEL_"+to_string(labelCount);
        int l = line + stoi(imm) + 1;
        if(!labelExists(l)){
          addLabel(l,label);
          return (op + " " + rs + ", " + rt + ", "+label);
        }
        else
          return (op + " " + rs + ", " + rt + ", "+getLabel(l));
    }
    return (op + " " + rt + ", " + rs + ", " + imm);
}